

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

void __thiscall
aeron::archive::AeronArchive::truncateRecording
          (AeronArchive *this,int64_t recordingId,int64_t position)

{
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  int64_t local_30;
  int64_t local_28;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_30 = position;
  local_28 = recordingId;
  local_58._M_unused._M_object = operator_new(0x18);
  *(AeronArchive **)local_58._M_unused._0_8_ = this;
  *(int64_t **)((long)local_58._M_unused._0_8_ + 8) = &local_28;
  *(int64_t **)((long)local_58._M_unused._0_8_ + 0x10) = &local_30;
  pcStack_40 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:284:9)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:284:9)>
             ::_M_manager;
  callAndPollForResponse(this,(function<bool_(long)> *)&local_58,"truncate recording");
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

void AeronArchive::truncateRecording(std::int64_t recordingId, std::int64_t position) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->truncateRecording(recordingId, position, correlationId, controlSessionId_);
        },
        "truncate recording");
}